

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  byte bVar1;
  Expression_lhs EVar2;
  ContextOptions *pCVar3;
  String local_30;
  
  bVar1 = **(byte **)this;
  EVar2 = this[9];
  if (((bVar1 ^ (byte)EVar2) & 1) != 0) {
    pCVar3 = getContextOptions();
    if (pCVar3->success != true) {
      String::String(&local_30);
      Result::Result(__return_storage_ptr__,true,&local_30);
      goto LAB_0015d80f;
    }
  }
  doctest::toString(&local_30,*(bool *)*(undefined8 *)this);
  Result::Result(__return_storage_ptr__,(bool)((bVar1 ^ (byte)EVar2) & 1),&local_30);
LAB_0015d80f:
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }